

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::fade(Image *__return_storage_ptr__,Image *_A,Image *_B,float _pct)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int _channels;
  ostream *poVar4;
  long lVar5;
  thread *thrd_1;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  Image *local_b0;
  Image *local_a8;
  size_t local_a0;
  id local_98;
  float local_90;
  thread local_88;
  thread thrd;
  size_t end;
  size_t start;
  int t;
  size_t pixelsLeftOver;
  size_t pixelsPerThread;
  undefined1 local_50 [4];
  int nThreads;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  float _pct_local;
  Image *_B_local;
  Image *_A_local;
  Image *out;
  
  iVar2 = (*_A->_vptr_Image[6])();
  iVar3 = (*_A->_vptr_Image[7])();
  _channels = (*_A->_vptr_Image[8])();
  Image::Image(__return_storage_ptr__,iVar2,iVar3,_channels);
  iVar2 = (*_A->_vptr_Image[6])();
  iVar3 = (*_B->_vptr_Image[6])();
  if (iVar2 == iVar3) {
    iVar2 = (*_A->_vptr_Image[7])();
    iVar3 = (*_B->_vptr_Image[7])();
    if (iVar2 == iVar3) {
      iVar2 = (*_A->_vptr_Image[8])();
      iVar3 = (*_B->_vptr_Image[8])();
      if (iVar2 == iVar3) {
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_50);
        iVar2 = std::thread::hardware_concurrency();
        iVar3 = (*_A->_vptr_Image[7])();
        lVar5 = (long)(iVar3 / iVar2);
        iVar3 = (*_A->_vptr_Image[7])();
        for (start._4_4_ = 0; start._4_4_ < iVar2; start._4_4_ = start._4_4_ + 1) {
          local_a0 = start._4_4_ * lVar5;
          thrd._M_id._M_thread = (id)(local_a0 + lVar5);
          if (start._4_4_ == iVar2 + -1) {
            thrd._M_id._M_thread = (id)(local_a0 + lVar5 + (long)(iVar3 % iVar2));
          }
          local_98 = thrd._M_id._M_thread;
          __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)__return_storage_ptr__;
          local_b0 = _A;
          local_a8 = _B;
          local_90 = _pct;
          std::thread::thread<vera::fade(vera::Image_const&,vera::Image_const&,float)::__0,,void>
                    (&local_88,(type *)&__range1);
          std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                    ((vector<std::thread,_std::allocator<std::thread>_> *)local_50,&local_88);
          std::thread::~thread(&local_88);
        }
        __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                           ((vector<std::thread,_std::allocator<std::thread>_> *)local_50);
        thrd_1 = (thread *)
                 std::vector<std::thread,_std::allocator<std::thread>_>::end
                           ((vector<std::thread,_std::allocator<std::thread>_> *)local_50);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                           *)&thrd_1), bVar1) {
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator*(&__end1);
          std::thread::join();
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator++(&__end1);
        }
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_50);
        return __return_storage_ptr__;
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Images can\'t be mixed because they have different sizes (");
  iVar2 = (*_A->_vptr_Image[6])();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,"x");
  iVar2 = (*_A->_vptr_Image[7])();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4," vs ");
  iVar2 = (*_B->_vptr_Image[6])();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,"x");
  iVar2 = (*_B->_vptr_Image[7])();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,")");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return __return_storage_ptr__;
}

Assistant:

Image fade(const Image& _A, const Image& _B, float _pct) {
    Image out = Image(_A.getWidth(), _A.getHeight(), _A.getChannels());

    if (_A.getWidth() != _B.getWidth() || _A.getHeight() != _B.getHeight() || _A.getChannels() != _B.getChannels()) {
        std::cout << "Images can't be mixed because they have different sizes (" << _A.getWidth() << "x" << _A.getHeight() << " vs " << _B.getWidth() << "x" << _B.getHeight() << ")" << std::endl;
        return out;
    }

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t pixelsPerThread = _A.getHeight() / nThreads;
    size_t pixelsLeftOver = _A.getHeight() % nThreads;
    for (int t = 0; t < nThreads; ++t) {
        size_t start = t * pixelsPerThread;
        size_t end = start + pixelsPerThread;
        if (t == nThreads - 1)
            end = start + pixelsPerThread + pixelsLeftOver;

        std::thread thrd( 
            [&out, &_A, &_B, start, end, _pct]() {
                for (size_t y = start; y < end; y++)
                for (size_t x = 0; x < _A.getWidth(); x++) {
                    size_t i = _A.getIndex(x, y);
                    out.setColor(i, glm::mix(_A.getColor(i), _B.getColor(i), _pct));
                }
            }
        );
        threads.push_back(std::move(thrd));
    }
    for (std::thread& thrd : threads)
        thrd.join();

    return out;
}